

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Area.cpp
# Opt level: O0

unsigned_long __thiscall Area::AddRoom(Area *this,shared_ptr<Room> *room)

{
  size_type sVar1;
  element_type *this_00;
  u_long room_id;
  shared_ptr<Room> *room_local;
  Area *this_local;
  
  std::vector<std::shared_ptr<Room>,_std::allocator<std::shared_ptr<Room>_>_>::push_back
            (&this->m_rooms,room);
  sVar1 = std::vector<std::shared_ptr<Room>,_std::allocator<std::shared_ptr<Room>_>_>::size
                    (&this->m_rooms);
  this_00 = std::__shared_ptr_access<Room,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Room,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)room);
  Room::SetID(this_00,(int)(sVar1 - 1));
  return sVar1 - 1;
}

Assistant:

unsigned long Area::AddRoom(std::shared_ptr<Room> room) {
    m_rooms.push_back(room);
    u_long room_id = m_rooms.size() - 1;
    room->SetID((int)room_id);
    return room_id;
}